

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O2

void __thiscall
TPZFrontSym<std::complex<long_double>_>::SymbolicAddKel
          (TPZFrontSym<std::complex<long_double>_> *this,TPZVec<long> *destinationindex)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = 0;
  lVar4 = destinationindex->fNElements;
  if (destinationindex->fNElements < 1) {
    lVar4 = lVar3;
  }
  for (; lVar4 != lVar3; lVar3 = lVar3 + 1) {
    Local(this,destinationindex->fStore[lVar3]);
    (this->super_TPZFront<std::complex<long_double>_>).fFront =
         (this->super_TPZFront<std::complex<long_double>_>).fGlobal.super_TPZVec<long>.fNElements;
  }
  lVar4 = (this->super_TPZFront<std::complex<long_double>_>).fFront;
  iVar1 = (this->super_TPZFront<std::complex<long_double>_>).fMaxFront;
  iVar2 = (int)lVar4;
  if (lVar4 < iVar1) {
    iVar2 = iVar1;
  }
  (this->super_TPZFront<std::complex<long_double>_>).fMaxFront = iVar2;
  return;
}

Assistant:

void TPZFrontSym<TVar>::SymbolicAddKel(TPZVec < int64_t > & destinationindex)
{
	int64_t i, loop_limit, aux;
	loop_limit=destinationindex.NElements();
	for(i=0;i<loop_limit;i++){
		aux=destinationindex[i];
		Local(aux);
		this->fFront = this->fGlobal.NElements();
	}
	this->fMaxFront=(this->fFront<this->fMaxFront)?this->fMaxFront:this->fFront;
	
}